

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecLogicalAnd(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> local_70;
  undefined1 local_68 [8];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> rightExpr;
  Token oper;
  Parser *this_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *expr;
  
  parsePrecEquality(this);
  while (bVar1 = consume(in_RSI,AND), bVar1) {
    Token::Token((Token *)&rightExpr,&in_RSI->m_previous);
    parsePrecEquality((Parser *)local_68);
    std::
    make_unique<enact::LogicalExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token>
              (&local_70,(unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)this,
               (Token *)local_68);
    std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::operator=
              ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,
               (unique_ptr<enact::LogicalExpr,_std::default_delete<enact::LogicalExpr>_> *)&local_70
              );
    std::unique_ptr<enact::LogicalExpr,_std::default_delete<enact::LogicalExpr>_>::~unique_ptr
              ((unique_ptr<enact::LogicalExpr,_std::default_delete<enact::LogicalExpr>_> *)&local_70
              );
    std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_68);
    Token::~Token((Token *)&rightExpr);
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecLogicalAnd() {
        std::unique_ptr<Expr> expr = parsePrecEquality();

        while (consume(TokenType::AND)) {
            Token oper = m_previous;
            std::unique_ptr<Expr> rightExpr = parsePrecEquality();
            expr = std::make_unique<LogicalExpr>(std::move(expr), std::move(rightExpr), std::move(oper));
        }

        return expr;
    }